

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

enable_if_t<std::is_unsigned<unsigned_long>::value,_unsigned_long>
Catch::Detail::transposeToNaturalOrder<unsigned_long,unsigned_long>(unsigned_long in)

{
  unsigned_long in_local;
  
  return in;
}

Assistant:

std::enable_if_t<std::is_unsigned<OriginalType>::value, UnsignedType>
            transposeToNaturalOrder(UnsignedType in) {
            static_assert(
                sizeof( OriginalType ) == sizeof( UnsignedType ),
                "reordering requires the same sized types on both sides" );
            static_assert( std::is_unsigned<UnsignedType>::value, "Input type must be unsigned" );
            // No reordering is needed for unsigned -> unsigned
            return in;
        }